

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

void re2::AppendLiteral(string *t,Rune r,bool foldcase)

{
  char *pcVar1;
  bool foldcase_local;
  Rune r_local;
  string *t_local;
  
  if (((r == 0) || (0x7f < r)) || (pcVar1 = strchr("(){}[]*+?|.^$\\",r), pcVar1 == (char *)0x0)) {
    if (((foldcase) && (0x60 < r)) && (r < 0x7b)) {
      std::__cxx11::string::append((ulong)t,'\x01');
      std::__cxx11::string::append((ulong)t,'\x01');
      std::__cxx11::string::append((ulong)t,'\x01');
      std::__cxx11::string::append((ulong)t,'\x01');
    }
    else {
      AppendCCRange(t,r,r);
    }
  }
  else {
    std::__cxx11::string::append((ulong)t,'\x01');
    std::__cxx11::string::append((ulong)t,'\x01');
  }
  return;
}

Assistant:

static void AppendLiteral(string *t, Rune r, bool foldcase) {
  if (r != 0 && r < 0x80 && strchr("(){}[]*+?|.^$\\", r)) {
    t->append(1, '\\');
    t->append(1, static_cast<char>(r));
  } else if (foldcase && 'a' <= r && r <= 'z') {
    if ('a' <= r && r <= 'z')
      r += 'A' - 'a';
    t->append(1, '[');
    t->append(1, static_cast<char>(r));
    t->append(1, static_cast<char>(r) + 'a' - 'A');
    t->append(1, ']');
  } else {
    AppendCCRange(t, r, r);
  }
}